

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O3

size_t __thiscall AddrManImpl::Size(AddrManImpl *this,optional<Network> net,optional<bool> in_new)

{
  size_t sVar1;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock3;
  unique_lock<std::mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_owns = false;
  local_30._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_30);
  Check(this);
  sVar1 = Size_(this,net,in_new);
  Check(this);
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return sVar1;
  }
  __stack_chk_fail();
}

Assistant:

size_t AddrManImpl::Size(std::optional<Network> net, std::optional<bool> in_new) const
{
    LOCK(cs);
    Check();
    auto ret = Size_(net, in_new);
    Check();
    return ret;
}